

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soupfile.hh
# Opt level: O3

size_t __thiscall
helix::nasdaq::soupfile_session<helix::nasdaq::nordic_itch_handler>::process_packet
          (soupfile_session<helix::nasdaq::nordic_itch_handler> *this,packet_view *packet)

{
  char *pcVar1;
  _Alloc_hider __s;
  size_type __n;
  int iVar2;
  void *pvVar3;
  runtime_error *this_00;
  size_t sVar4;
  ulong uVar5;
  
  if (process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&process_packet(helix::net::packet_view_const&)::
                                 terminator_abi_cxx11_);
    if (iVar2 != 0) {
      process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_._M_dataplus._M_p =
           (pointer)&process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_,
                 "\r\n","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_);
    }
  }
  __n = process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_._M_string_length;
  __s._M_p = process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_._M_dataplus._M_p;
  if ((process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_._M_string_length != 0)
     && (sVar4 = packet->_len, sVar4 != 0)) {
    pcVar1 = packet->_buf;
    uVar5 = 0;
    do {
      pvVar3 = memchr(__s._M_p,(int)pcVar1[uVar5],__n);
      if (pvVar3 != (void *)0x0) {
        if (uVar5 == 0) {
          sVar4 = 0;
        }
        else {
          sVar4 = nordic_itch_handler::process_packet(&this->_handler,packet);
          if (uVar5 < sVar4) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"parsed message is larger than the framing");
            goto LAB_00115ddb;
          }
          sVar4 = uVar5 + process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_.
                          _M_string_length;
        }
        return sVar4;
      }
      uVar5 = uVar5 + 1;
    } while (sVar4 != uVar5);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"packet is truncated");
LAB_00115ddb:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t soupfile_session<Handler>::process_packet(const net::packet_view& packet)
{
    static std::string terminator = "\r\n";
    auto view = packet.as_string_view();
    auto terminator_start = view.find_first_of(terminator);
    if (terminator_start == std::experimental::string_view::npos) {
        throw std::runtime_error("packet is truncated");
    }
    if (!terminator_start) {
        return 0;
    }
    auto nr = _handler.process_packet(packet);
    if (nr > terminator_start) {
        throw std::runtime_error("parsed message is larger than the framing");
    }
    return terminator_start + terminator.size();
}